

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyParserAnimation.cpp
# Opt level: O3

bool Rml::PropertyParserAnimation::ParseAnimation(Property *property,StringList *animation_values)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  code *pcVar1;
  bool bVar2;
  Table<true,80ul,std::__cxx11::string,Rml::Keyword,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
  *pTVar3;
  Property *pPVar4;
  pointer pbVar5;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  size_t sVar12;
  String *string;
  byte bVar13;
  pointer key;
  long lVar14;
  int count;
  StringList arguments;
  Animation animation;
  AnimationList animation_list;
  float number;
  byte local_13d;
  int local_134;
  Property *local_130;
  StringList local_128;
  undefined1 local_110 [40];
  _Alloc_hider local_e8;
  size_type local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  vector<Rml::Animation,_std::allocator<Rml::Animation>_> local_c8;
  Unit *local_b0;
  String *local_a8;
  String *local_a0;
  AnimationList local_98;
  Variant local_80;
  undefined8 local_58;
  PropertyDefinition *pPStack_50;
  int local_48;
  element_type *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_38;
  
  local_c8.super__Vector_base<Rml::Animation,_std::allocator<Rml::Animation>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super__Vector_base<Rml::Animation,_std::allocator<Rml::Animation>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.super__Vector_base<Rml::Animation,_std::allocator<Rml::Animation>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  string = (animation_values->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_a8 = (animation_values->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_130 = property;
  if (string != local_a8) {
    local_b0 = &property->unit;
    do {
      local_110._0_4_ = 0.0;
      Tween::Tween((Tween *)(local_110 + 8),Linear,Out);
      local_110._24_4_ = 0.0;
      local_110[0x1c] = false;
      local_110[0x1d] = false;
      local_110._32_4_ = 1;
      local_e8._M_p = (pointer)&local_d8;
      local_e0 = 0;
      local_d8._M_local_buf[0] = '\0';
      local_128.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_128.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_128.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_a0 = string;
      StringUtilities::ExpandString(&local_128,string,' ');
      pbVar5 = local_128.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_128.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_128.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        bVar2 = false;
        bVar9 = false;
        bVar10 = false;
        key = local_128.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
        do {
          if (key->_M_string_length == 0) goto LAB_0024d820;
          if ((DAT_0033b7d8 ==
               (Table<true,80ul,std::__cxx11::string,Rml::Keyword,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                *)0x0) &&
             (bVar8 = Assert("Resource used before it was initialized, or after it was shut down.",
                             "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                             ,0x46), !bVar8)) {
LAB_0024da28:
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          pTVar3 = DAT_0033b7d8;
          sVar12 = robin_hood::detail::
                   Table<true,80ul,std::__cxx11::string,Rml::Keyword,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                   ::findIdx<std::__cxx11::string>(DAT_0033b7d8,key);
          lVar14 = sVar12 * 0x38 + *(long *)pTVar3;
          if ((DAT_0033b7d8 ==
               (Table<true,80ul,std::__cxx11::string,Rml::Keyword,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                *)0x0) &&
             (bVar8 = Assert("Resource used before it was initialized, or after it was shut down.",
                             "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                             ,0x46), !bVar8)) goto LAB_0024da28;
          if (lVar14 == *(long *)(DAT_0033b7d8 + 8)) {
switchD_0024d73e_caseD_2:
            local_80.type = local_80.type & 0xffffffff00000000;
            local_134 = 0;
            iVar11 = __isoc99_sscanf((key->_M_dataplus)._M_p,"%fs%n",&local_80,&local_134);
            if (iVar11 == 1) {
              if (local_134 < 1) {
                if (!bVar2) {
                  local_110._32_4_ = Math::RoundToInteger((float)(undefined4)local_80.type);
                  goto LAB_0024d806;
                }
                goto LAB_0024d878;
              }
              if (bVar10) {
                if (bVar9) goto LAB_0024d878;
                local_110._24_4_ = (undefined4)local_80.type;
                bVar10 = true;
                bVar9 = true;
              }
              else {
                local_110._0_4_ = (undefined4)local_80.type;
                bVar10 = true;
              }
            }
            else {
              ::std::__cxx11::string::_M_assign((string *)&local_e8);
            }
          }
          else {
            switch(*(undefined4 *)(lVar14 + 0x20)) {
            case 0:
              if (local_c8.super__Vector_base<Rml::Animation,_std::allocator<Rml::Animation>_>.
                  _M_impl.super__Vector_impl_data._M_finish !=
                  local_c8.super__Vector_base<Rml::Animation,_std::allocator<Rml::Animation>_>.
                  _M_impl.super__Vector_impl_data._M_start) goto LAB_0024d89b;
              local_98.super__Vector_base<Rml::Animation,_std::allocator<Rml::Animation>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_98.super__Vector_base<Rml::Animation,_std::allocator<Rml::Animation>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_98.super__Vector_base<Rml::Animation,_std::allocator<Rml::Animation>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_80.type = NONE;
              Variant::Set(&local_80,&local_98);
              pPVar4 = local_130;
              local_58 = 0xffffffff00400000;
              local_40 = (element_type *)0x0;
              p_Stack_38 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              pPStack_50 = (PropertyDefinition *)0x0;
              local_48 = -1;
              Variant::operator=(&local_130->value,&local_80);
              p_Var7 = p_Stack_38;
              peVar6 = local_40;
              *(undefined8 *)local_b0 = local_58;
              *(PropertyDefinition **)(local_b0 + 2) = pPStack_50;
              local_b0[4] = local_48;
              local_40 = (element_type *)0x0;
              p_Stack_38 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              this = (pPVar4->source).
                     super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
              (pPVar4->source).
              super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   peVar6;
              (pPVar4->source).
              super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = p_Var7;
              if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                 (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
                 p_Stack_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_38);
              }
              Variant::~Variant(&local_80);
              ::std::vector<Rml::Animation,_std::allocator<Rml::Animation>_>::~vector(&local_98);
              bVar13 = 1;
              bVar10 = false;
              goto LAB_0024d89e;
            case 1:
              local_110._8_4_ = *(Type *)(lVar14 + 0x28);
              local_110._12_4_ = *(Type *)(lVar14 + 0x2c);
              local_110._16_4_ = *(undefined4 *)(lVar14 + 0x30);
              local_110._20_4_ = *(undefined4 *)(lVar14 + 0x34);
              break;
            default:
              goto switchD_0024d73e_caseD_2;
            case 3:
              local_110[0x1c] = true;
              break;
            case 4:
              if (bVar2) goto LAB_0024d878;
              local_110._32_4_ = -1;
LAB_0024d806:
              bVar2 = true;
              break;
            case 5:
              local_110[0x1d] = true;
            }
          }
LAB_0024d820:
          key = key + 1;
        } while (key != pbVar5);
      }
      bVar10 = false;
      if (local_e0 == 0) {
LAB_0024d878:
        bVar10 = false;
        bVar13 = 0;
      }
      else if (((float)local_110._0_4_ <= 0.0) || ((int)local_110._32_4_ < -1)) {
LAB_0024d89b:
        bVar10 = false;
        bVar13 = 0;
      }
      else {
        bVar13 = 0;
        if (local_110._32_4_ != 0) {
          bVar10 = true;
          ::std::vector<Rml::Animation,_std::allocator<Rml::Animation>_>::
          emplace_back<Rml::Animation>(&local_c8,(Animation *)local_110);
          bVar13 = local_13d;
        }
      }
LAB_0024d89e:
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_p != &local_d8) {
        operator_delete(local_e8._M_p,
                        CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0]) + 1)
        ;
      }
      if (!bVar10) goto LAB_0024da02;
      string = local_a0 + 1;
      local_13d = bVar13;
    } while (string != local_a8);
  }
  pPVar4 = local_130;
  Variant::Clear(&local_130->value);
  Variant::Set(&pPVar4->value,&local_c8);
  pPVar4->unit = ANIMATION;
  bVar13 = 1;
LAB_0024da02:
  ::std::vector<Rml::Animation,_std::allocator<Rml::Animation>_>::~vector(&local_c8);
  return (bool)(bVar13 & 1);
}

Assistant:

bool PropertyParserAnimation::ParseAnimation(Property& property, const StringList& animation_values)
{
	AnimationList animation_list;

	for (const String& single_animation_value : animation_values)
	{
		Animation animation;

		StringList arguments;
		StringUtilities::ExpandString(arguments, single_animation_value, ' ');

		bool duration_found = false;
		bool delay_found = false;
		bool num_iterations_found = false;

		for (auto& argument : arguments)
		{
			if (argument.empty())
				continue;

			// See if we have a <keyword> or <tween> specifier as defined in keywords
			auto it = parser_data->keywords.find(argument);
			if (it != parser_data->keywords.end() && it->second.ValidAnimation())
			{
				switch (it->second.type)
				{
				case KeywordType::None:
				{
					if (animation_list.size() > 0) // The none keyword can not be part of multiple definitions
						return false;
					property = Property{AnimationList{}, Unit::ANIMATION};
					return true;
				}
				break;
				case KeywordType::Tween: animation.tween = it->second.tween; break;
				case KeywordType::Alternate: animation.alternate = true; break;
				case KeywordType::Infinite:
					if (num_iterations_found)
						return false;
					animation.num_iterations = -1;
					num_iterations_found = true;
					break;
				case KeywordType::Paused: animation.paused = true; break;
				default: break;
				}
			}
			else
			{
				// Either <duration>, <delay>, <num_iterations> or a <keyframes-name>
				float number = 0.0f;
				int count = 0;

				if (sscanf(argument.c_str(), "%fs%n", &number, &count) == 1)
				{
					// Found a number, if there was an 's' unit, count will be positive
					if (count > 0)
					{
						// Duration or delay was assigned
						if (!duration_found)
						{
							duration_found = true;
							animation.duration = number;
						}
						else if (!delay_found)
						{
							delay_found = true;
							animation.delay = number;
						}
						else
							return false;
					}
					else
					{
						// No 's' unit means num_iterations was found
						if (!num_iterations_found)
						{
							animation.num_iterations = Math::RoundToInteger(number);
							num_iterations_found = true;
						}
						else
							return false;
					}
				}
				else
				{
					// Must be an animation name
					animation.name = argument;
				}
			}
		}

		// Validate the parsed transition
		if (animation.name.empty() || animation.duration <= 0.0f || (animation.num_iterations < -1 || animation.num_iterations == 0))
		{
			return false;
		}

		animation_list.push_back(std::move(animation));
	}

	property.value = std::move(animation_list);
	property.unit = Unit::ANIMATION;

	return true;
}